

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.h
# Opt level: O1

bool __thiscall
axl::xml::ExpatParserRoot::complete<bool>(ExpatParserRoot *this,bool result,bool failResult)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  if ((int)CONCAT71(in_register_00000011,failResult) == (int)CONCAT71(in_register_00000031,result))
  {
    getLastError((Error *)&BStack_28,this);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&BStack_28);
  }
  return result;
}

Assistant:

T
	complete(
		T result,
		T failResult
	) {
		if (result == failResult)
			err::setError(getLastError());

		return result;
	}